

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Input.cxx
# Opt level: O3

void Fl_Value_Input::input_cb(Fl_Widget *param_1,void *v)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = *(double *)((long)v + 0x98) / (double)*(int *)((long)v + 0xa0);
  dVar3 = floor(dVar2);
  if (((dVar2 == 0.0) && (!NAN(dVar2))) || (dVar3 < dVar2)) {
    dVar2 = strtod(*(char **)((long)v + 0x120),(char **)0x0);
  }
  else {
    lVar1 = strtol(*(char **)((long)v + 0x120),(char **)0x0,0);
    dVar2 = (double)lVar1;
  }
  if ((dVar2 != *(double *)((long)v + 0x78)) || (NAN(dVar2) || NAN(*(double *)((long)v + 0x78)))) {
    *(double *)((long)v + 0x78) = dVar2;
    *(byte *)((long)v + 0x60) = *(byte *)((long)v + 0x60) | 0x80;
    if (*(byte *)((long)v + 0x6f) != 0) goto LAB_001dc182;
  }
  else if ((*(byte *)((long)v + 0x6f) & 2) != 0) {
    *(double *)((long)v + 0x78) = dVar2;
    *(byte *)((long)v + 0x60) = *(byte *)((long)v + 0x60) | 0x80;
LAB_001dc182:
    Fl_Widget::do_callback((Fl_Widget *)v,(Fl_Widget *)v,*(void **)((long)v + 0x18));
    return;
  }
  return;
}

Assistant:

void Fl_Value_Input::input_cb(Fl_Widget*, void* v) {
  Fl_Value_Input& t = *(Fl_Value_Input*)v;
  double nv;
  if ((t.step() - floor(t.step()))>0.0 || t.step() == 0.0) nv = strtod(t.input.value(), 0);
  else nv = strtol(t.input.value(), 0, 0);
  if (nv != t.value() || t.when() & FL_WHEN_NOT_CHANGED) {
    t.set_value(nv);
    t.set_changed();
    if (t.when()) t.do_callback();
  }
}